

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter_tests.c
# Opt level: O2

void teardown_cdash_reporter_tests(void)

{
  (*reporter->destroy)(reporter);
  if (output != (char *)0x0) {
    free(output);
    output = (char *)0x0;
  }
  return;
}

Assistant:

static void teardown_cdash_reporter_tests(void) {
    reporter->destroy(reporter);

    //bad mojo when running tests in same process, as destroy_reporter also sets
    //context.reporter = NULL, thus breaking the next test to run
    if (NULL != output) {
        free(output);
        //need to set output to NULL to avoid second free in subsequent call to setup_cdash_reporter_tests->clear_output
        //when running tests in same process
        output = NULL;
    }
}